

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::cmComputeLinkDepends
          (cmComputeLinkDepends *this,cmTarget *target,string *config)

{
  byte bVar1;
  bool bVar2;
  LinkLibraryType LVar3;
  cmMakefile *pcVar4;
  cmGlobalGenerator *pcVar5;
  cmake *pcVar6;
  allocator local_71;
  string local_70;
  string local_50 [48];
  string *local_20;
  string *config_local;
  cmTarget *target_local;
  cmComputeLinkDepends *this_local;
  
  local_20 = config;
  config_local = (string *)target;
  target_local = (cmTarget *)this;
  std::__cxx11::string::string((string *)&this->Config);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  vector(&this->FinalLinkEntries);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  vector(&this->EntryList);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->LinkEntryIndex);
  std::
  queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>,void>
            ((queue<cmComputeLinkDepends::BFSEntry,std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>>
              *)&this->BFSQueue);
  std::
  queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
  ::
  queue<std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>,void>
            ((queue<cmComputeLinkDepends::SharedDepEntry,std::deque<cmComputeLinkDepends::SharedDepEntry,std::allocator<cmComputeLinkDepends::SharedDepEntry>>>
              *)&this->SharedDepQueue);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->SharedDepFollowed);
  std::
  vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
  ::vector(&this->InferredDependSets);
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->EntryConstraintGraph);
  std::vector<char,_std::allocator<char>_>::vector(&this->ComponentVisited);
  std::vector<int,_std::allocator<int>_>::vector(&this->ComponentOrder);
  std::
  map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
  ::map(&this->PendingComponents);
  std::vector<int,_std::allocator<int>_>::vector(&this->FinalLinkOrder);
  std::vector<int,_std::allocator<int>_>::vector(&this->OriginalEntries);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            (&this->OldWrongConfigItems);
  this->Target = (cmTarget *)config_local;
  pcVar4 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar4;
  pcVar5 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this->GlobalGenerator = pcVar5;
  pcVar6 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
  this->CMakeInstance = pcVar6;
  bVar1 = std::__cxx11::string::empty();
  this->HasConfig = (bool)((bVar1 ^ 0xff) & 1);
  if ((this->HasConfig & 1U) == 0) {
    std::__cxx11::string::string(local_50);
  }
  else {
    std::__cxx11::string::string(local_50,(string *)local_20);
  }
  std::__cxx11::string::operator=((string *)&this->Config,local_50);
  std::__cxx11::string::~string(local_50);
  LVar3 = cmTarget::ComputeLinkType(this->Target,&this->Config);
  this->LinkType = LVar3;
  pcVar4 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CMAKE_LINK_DEPENDS_DEBUG_MODE",&local_71);
  bVar2 = cmMakefile::IsOn(pcVar4,&local_70);
  this->DebugMode = bVar2;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  this->OldLinkDirMode = false;
  this->CCG = (cmComputeComponentGraph *)0x0;
  return;
}

Assistant:

cmComputeLinkDepends
::cmComputeLinkDepends(cmTarget const* target, const std::string& config)
{
  // Store context information.
  this->Target = target;
  this->Makefile = this->Target->GetMakefile();
  this->GlobalGenerator = this->Makefile->GetGlobalGenerator();
  this->CMakeInstance = this->GlobalGenerator->GetCMakeInstance();

  // The configuration being linked.
  this->HasConfig = !config.empty();
  this->Config = (this->HasConfig)? config : std::string();
  this->LinkType = this->Target->ComputeLinkType(this->Config);

  // Enable debug mode if requested.
  this->DebugMode = this->Makefile->IsOn("CMAKE_LINK_DEPENDS_DEBUG_MODE");

  // Assume no compatibility until set.
  this->OldLinkDirMode = false;

  // No computation has been done.
  this->CCG = 0;
}